

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionBody::LoadDynamicProfileInfo(FunctionBody *this)

{
  uint sourceContextId;
  SourceDynamicProfileManager *this_00;
  code *pcVar1;
  bool bVar2;
  DynamicProfileInfo *pDVar3;
  undefined4 *puVar4;
  FunctionInfo *pFVar5;
  
  this_00 = (((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
                m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceDynamicProfileManager).ptr;
  if (this_00 != (SourceDynamicProfileManager *)0x0) {
    pDVar3 = SourceDynamicProfileManager::GetDynamicProfileInfo(this_00,this);
    Memory::Recycler::WBSetBit((char *)&this->dynamicProfileInfo);
    (this->dynamicProfileInfo).ptr = pDVar3;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->dynamicProfileInfo);
    if ((this->dynamicProfileInfo).ptr != (DynamicProfileInfo *)0x0) {
      pFVar5 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      sourceContextId =
           ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
              m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
      if (pFVar5 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
        pFVar5 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      bVar2 = Phases::IsEnabled((Phases *)&DAT_015962f8,DynamicProfilePhase,sourceContextId,
                                pFVar5->functionId);
      if (bVar2) {
        Output::Print(L"Loaded:");
        DynamicProfileInfo::Dump((this->dynamicProfileInfo).ptr,this,(ArenaAllocator *)0x0);
      }
    }
  }
  DynamicProfileMutator::Mutate(this);
  return;
}

Assistant:

void FunctionBody::LoadDynamicProfileInfo()
    {
        SourceDynamicProfileManager * sourceDynamicProfileManager = GetSourceContextInfo()->sourceDynamicProfileManager;
        if (sourceDynamicProfileManager != nullptr)
        {
            this->dynamicProfileInfo = sourceDynamicProfileManager->GetDynamicProfileInfo(this);
#if DBG_DUMP
            if(this->dynamicProfileInfo)
            {
                if (Configuration::Global.flags.Dump.IsEnabled(DynamicProfilePhase, this->GetSourceContextId(), this->GetLocalFunctionId()))
                {
                    Output::Print(_u("Loaded:"));
                    this->dynamicProfileInfo->Dump(this);
                }
            }
#endif
        }

#ifdef DYNAMIC_PROFILE_MUTATOR
        DynamicProfileMutator::Mutate(this);
#endif
    }